

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::constant_op_expression_abi_cxx11_(CompilerGLSL *this,SPIRConstantOp *cop)

{
  __node_base_ptr *this_00;
  uint32_t right;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  SPIRType *type_00;
  ulong uVar9;
  TypedID *this_01;
  TypedID<(spirv_cross::Types)3> *pTVar10;
  mapped_type *initializers;
  CompilerError *pCVar11;
  uint *puVar12;
  SPIRType *pSVar13;
  size_t sVar14;
  long in_RDX;
  undefined1 local_958 [32];
  undefined1 local_938 [32];
  undefined1 local_918 [40];
  SPIRType expected;
  SPIRType *arg_type;
  spirv_cross local_770 [39];
  char local_749;
  undefined1 local_748 [8];
  SPIRType expected_type;
  string cast_op1;
  string local_5c8 [8];
  string cast_op0;
  BaseType local_5a0;
  uint32_t uStack_59c;
  bool skip_cast_if_equal_type;
  BaseType input_type;
  uint32_t bit_width;
  undefined1 local_590 [8];
  SPIRConstant tmp_const;
  TypedID<(spirv_cross::Types)3> local_420;
  TypeID local_41c;
  uint32_t local_418;
  ConstantID local_414;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> local_410;
  TypeID local_3d4;
  ConstantID local_3d0;
  TypedID<(spirv_cross::Types)3> local_3cc;
  uint32_t local_3c8;
  uint32_t local_3c4;
  uint32_t old_const;
  uint32_t new_const;
  uint32_t target_type_id;
  uint32_t target_id;
  uint32_t idx;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> new_init;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310 [32];
  undefined1 local_2f0 [36];
  TypedID<(spirv_cross::Types)0> local_2cc;
  undefined1 local_2c8 [8];
  SPIRConstant c;
  uint32_t index;
  uint32_t i;
  string right_arg;
  undefined1 local_138 [8];
  string left_arg;
  uint32_t left_components;
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  undefined1 local_c8 [32];
  undefined1 local_a8 [40];
  uint32_t op1;
  uint32_t op0;
  string local_50 [8];
  string op;
  bool unary;
  bool binary;
  SPIRType *type;
  SPIRConstantOp *cop_local;
  CompilerGLSL *this_local;
  string *expr;
  
  uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)(in_RDX + 0x48));
  type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)cop,uVar6);
  bVar3 = false;
  bVar2 = false;
  ::std::__cxx11::string::string(local_50);
  bVar5 = is_legacy((CompilerGLSL *)cop);
  if ((bVar5) && (bVar5 = is_unsigned_opcode(*(Op *)(in_RDX + 0xc)), bVar5)) {
    pCVar11 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar11,"Unsigned integers are not supported on legacy targets.");
    __cxa_throw(pCVar11,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  uVar6 = (uint32_t)cop;
  switch(*(undefined4 *)(in_RDX + 0xc)) {
  case 0x4f:
    type_to_glsl_constructor_abi_cxx11_(this,(SPIRType *)cop);
    ::std::__cxx11::string::operator+=((string *)this,"(");
    puVar12 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
    pSVar13 = Compiler::expression_type((Compiler *)cop,*puVar12);
    uVar1 = pSVar13->vecsize;
    puVar12 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
    to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_138,uVar6,SUB41(*puVar12,0));
    puVar12 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),1);
    to_enclosed_expression_abi_cxx11_((CompilerGLSL *)&index,uVar6,SUB41(*puVar12,0));
    for (c._356_4_ = 2; uVar4 = c._356_4_,
        sVar14 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(in_RDX + 0x10)),
        (uint)uVar4 < (uint)sVar14; c._356_4_ = c._356_4_ + 1) {
      puVar12 = VectorView<unsigned_int>::operator[]
                          ((VectorView<unsigned_int> *)(in_RDX + 0x10),(ulong)(uint)c._356_4_);
      c._352_4_ = *puVar12;
      if (c._352_4_ == 0xffffffff) {
        SPIRConstant::SPIRConstant((SPIRConstant *)local_2c8);
        c.super_IVariant._vptr_IVariant._4_4_ = (type_00->parent_type).id;
        uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type_00->parent_type);
        TypedID<(spirv_cross::Types)0>::TypedID(&local_2cc,0);
        uVar7 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_2cc);
        if (uVar6 == uVar7) {
          __assert_fail("type.parent_type != ID(0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_glsl.cpp"
                        ,0x1676,
                        "virtual string spirv_cross::CompilerGLSL::constant_op_expression(const SPIRConstantOp &)"
                       );
        }
        constant_expression_abi_cxx11_
                  ((CompilerGLSL *)local_2f0,(SPIRConstant *)cop,SUB81(local_2c8,0),false);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_2f0);
        ::std::__cxx11::string::~string((string *)local_2f0);
        SPIRConstant::~SPIRConstant((SPIRConstant *)local_2c8);
      }
      else if ((uint)c._352_4_ < uVar1) {
        ::std::operator+(local_370,local_138);
        ::std::operator+(local_350,(char)local_370);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_350);
        ::std::__cxx11::string::~string((string *)local_350);
        ::std::__cxx11::string::~string((string *)local_370);
      }
      else {
        ::std::operator+(local_330,(char *)&index);
        ::std::operator+(local_310,(char)local_330);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_310);
        ::std::__cxx11::string::~string((string *)local_310);
        ::std::__cxx11::string::~string((string *)local_330);
      }
      uVar8 = c._356_4_ + 1;
      sVar14 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(in_RDX + 0x10));
      if (uVar8 < (uint)sVar14) {
        ::std::__cxx11::string::operator+=((string *)this,", ");
      }
    }
    ::std::__cxx11::string::operator+=((string *)this,")");
    ::std::__cxx11::string::~string((string *)&index);
    ::std::__cxx11::string::~string((string *)local_138);
    goto LAB_0017b9f5;
  default:
    pCVar11 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar11,"Unimplemented spec constant op.");
    __cxa_throw(pCVar11,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case 0x51:
    new_init.stack_storage.aligned_char[0x1f] = '\0';
    puVar12 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
    uVar1 = *puVar12;
    puVar12 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),1);
    sVar14 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(in_RDX + 0x10));
    access_chain_internal_abi_cxx11_
              (this,uVar6,(uint32_t *)(ulong)uVar1,(uint32_t)puVar12,(int)sVar14 - 1,
               (AccessChainMeta *)0x1);
    new_init.stack_storage.aligned_char[0x1f] = '\x01';
    goto LAB_0017b9f5;
  case 0x52:
    puVar12 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),1);
    TypedID<(spirv_cross::Types)3>::TypedID((TypedID<(spirv_cross::Types)3> *)&target_id,*puVar12);
    get_composite_constant_ids
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)&idx,
               (CompilerGLSL *)cop,(ConstantID)target_id);
    new_const = TypedID::operator_cast_to_unsigned_int((TypedID *)(in_RDX + 8));
    old_const = TypedID::operator_cast_to_unsigned_int((TypedID *)(in_RDX + 0x48));
    for (target_type_id = 2; uVar9 = (ulong)target_type_id,
        sVar14 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(in_RDX + 0x10)),
        uVar9 < sVar14 - 1; target_type_id = target_type_id + 1) {
      local_3c4 = ParsedIR::increase_bound_by((ParsedIR *)&(cop->super_IVariant).self,1);
      puVar12 = VectorView<unsigned_int>::operator[]
                          ((VectorView<unsigned_int> *)(in_RDX + 0x10),(ulong)target_type_id);
      this_01 = (TypedID *)
                VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::operator[]
                          ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_> *)&idx,
                           (ulong)*puVar12);
      local_3c8 = TypedID::operator_cast_to_unsigned_int(this_01);
      TypedID<(spirv_cross::Types)3>::TypedID(&local_3cc,local_3c4);
      puVar12 = VectorView<unsigned_int>::operator[]
                          ((VectorView<unsigned_int> *)(in_RDX + 0x10),(ulong)target_type_id);
      pTVar10 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::operator[]
                          ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_> *)&idx,
                           (ulong)*puVar12);
      pTVar10->id = local_3cc.id;
      TypedID<(spirv_cross::Types)3>::TypedID(&local_3d0,new_const);
      TypedID<(spirv_cross::Types)1>::TypedID(&local_3d4,old_const);
      set_composite_constant
                ((CompilerGLSL *)cop,local_3d0,local_3d4,
                 (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)&idx);
      TypedID<(spirv_cross::Types)3>::TypedID(&local_414,local_3c8);
      get_composite_constant_ids(&local_410,(CompilerGLSL *)cop,local_414);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::operator=
                ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)&idx,&local_410);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::~SmallVector(&local_410);
      new_const = local_3c4;
      TypedID<(spirv_cross::Types)1>::TypedID(&local_41c,old_const);
      puVar12 = VectorView<unsigned_int>::operator[]
                          ((VectorView<unsigned_int> *)(in_RDX + 0x10),(ulong)target_type_id);
      local_418 = (uint32_t)get_composite_member_type((CompilerGLSL *)cop,local_41c,*puVar12);
      old_const = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_418);
    }
    puVar12 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
    TypedID<(spirv_cross::Types)3>::TypedID(&local_420,*puVar12);
    puVar12 = VectorView<unsigned_int>::operator[]
                        ((VectorView<unsigned_int> *)(in_RDX + 0x10),(ulong)target_type_id);
    pTVar10 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::operator[]
                        ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_> *)&idx,
                         (ulong)*puVar12);
    pTVar10->id = local_420.id;
    TypedID<(spirv_cross::Types)3>::TypedID
              ((TypedID<(spirv_cross::Types)3> *)&tmp_const.field_0x164,new_const);
    TypedID<(spirv_cross::Types)1>::TypedID
              ((TypedID<(spirv_cross::Types)1> *)&tmp_const.field_0x160,old_const);
    set_composite_constant
              ((CompilerGLSL *)cop,(ConstantID)tmp_const._356_4_,(TypeID)tmp_const._352_4_,
               (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)&idx);
    uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)(in_RDX + 0x48));
    SPIRConstant::SPIRConstant((SPIRConstant *)local_590,uVar6);
    bit_width = *(uint32_t *)(in_RDX + 0x48);
    input_type = TypedID::operator_cast_to_unsigned_int((TypedID *)(in_RDX + 8));
    initializers = ::std::
                   unordered_map<unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>_>
                   ::operator[]((unordered_map<unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>_>
                                 *)(cop[0x7a].arguments.stack_storage.aligned_char + 0x18),
                                &input_type);
    fill_composite_constant
              ((CompilerGLSL *)cop,(SPIRConstant *)local_590,(TypeID)bit_width,initializers);
    constant_expression_abi_cxx11_(this,(SPIRConstant *)cop,SUB81(local_590,0),false);
    SPIRConstant::~SPIRConstant((SPIRConstant *)local_590);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::~SmallVector
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)&idx);
    goto LAB_0017b9f5;
  case 0x71:
  case 0x72:
  case 0x73:
    type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)&op1,(SPIRType *)cop);
    ::std::__cxx11::string::operator=(local_50,(string *)&op1);
    ::std::__cxx11::string::~string((string *)&op1);
    break;
  case 0x7e:
    bVar2 = true;
    ::std::__cxx11::string::operator=(local_50,"-");
    break;
  case 0x80:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"+");
    break;
  case 0x82:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"-");
    break;
  case 0x84:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"*");
    break;
  case 0x86:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"/");
    break;
  case 0x87:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"/");
    break;
  case 0x89:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"%");
    break;
  case 0x8a:
    puVar12 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
    local_a8._36_4_ = *puVar12;
    puVar12 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),1);
    local_a8._32_4_ = *puVar12;
    to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_a8,uVar6,SUB41(local_a8._36_4_,0));
    to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_c8,uVar6,SUB41(local_a8._32_4_,0));
    to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_e8,uVar6,SUB41(local_a8._36_4_,0));
    to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_108,uVar6,SUB41(local_a8._32_4_,0));
    join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[4],char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              ((spirv_cross *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
               (char (*) [4])0x41078f,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
               (char (*) [4])0x4245d3,(char (*) [2])0x422b6e,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
               (char (*) [4])0x421289,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
               (char (*) [2])0x40bd22);
    ::std::__cxx11::string::~string((string *)local_108);
    ::std::__cxx11::string::~string((string *)local_e8);
    ::std::__cxx11::string::~string((string *)local_c8);
    ::std::__cxx11::string::~string((string *)local_a8);
    goto LAB_0017b9f5;
  case 0x8b:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"%");
    break;
  case 0xa4:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"==");
    break;
  case 0xa5:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"!=");
    break;
  case 0xa6:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"||");
    break;
  case 0xa7:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"&&");
    break;
  case 0xa8:
    bVar2 = true;
    ::std::__cxx11::string::operator=(local_50,"!");
    break;
  case 0xa9:
    sVar14 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(in_RDX + 0x10));
    if (sVar14 < 3) {
      pCVar11 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar11,"Not enough arguments to OpSpecConstantOp.");
      __cxa_throw(pCVar11,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    puVar12 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),2);
    uVar7 = *puVar12;
    puVar12 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),1);
    right = *puVar12;
    puVar12 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
    bVar5 = to_trivial_mix_op((CompilerGLSL *)cop,type_00,(string *)local_50,uVar7,right,*puVar12);
    if (!bVar5) {
      puVar12 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
      uVar6 = *puVar12;
      puVar12 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),1);
      uVar7 = *puVar12;
      VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),2);
      to_ternary_expression_abi_cxx11_(this,(SPIRType *)cop,(uint32_t)type_00,uVar6,uVar7);
      goto LAB_0017b9f5;
    }
    break;
  case 0xaa:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"==");
    break;
  case 0xab:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"!=");
    break;
  case 0xac:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,">");
    break;
  case 0xad:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,">");
    break;
  case 0xae:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,">=");
    break;
  case 0xaf:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,">=");
    break;
  case 0xb0:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"<");
    break;
  case 0xb1:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"<");
    break;
  case 0xb2:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"<=");
    break;
  case 0xb3:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"<=");
    break;
  case 0xc2:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,">>");
    break;
  case 0xc3:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,">>");
    break;
  case 0xc4:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"<<");
    break;
  case 0xc5:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"|");
    break;
  case 0xc6:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"^");
    break;
  case 199:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"&");
    break;
  case 200:
    bVar2 = true;
    ::std::__cxx11::string::operator=(local_50,"~");
  }
  uStack_59c = 0;
  if ((((bVar2) || (bVar3)) || (*(int *)(in_RDX + 0xc) == 0x72)) || (*(int *)(in_RDX + 0xc) == 0x71)
     ) {
    puVar12 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
    pSVar13 = Compiler::expression_type((Compiler *)cop,*puVar12);
    uStack_59c = pSVar13->width;
  }
  bVar5 = opcode_is_sign_invariant(*(Op *)(in_RDX + 0xc));
  switch(*(undefined4 *)(in_RDX + 0xc)) {
  case 0x71:
  case 0x86:
  case 0x89:
  case 0xac:
  case 0xae:
  case 0xb0:
  case 0xb2:
  case 0xc2:
    local_5a0 = to_unsigned_basetype(uStack_59c);
    break;
  case 0x72:
  case 0x7e:
  case 0x87:
  case 0x8b:
  case 0xad:
  case 0xaf:
  case 0xb1:
  case 0xb3:
  case 0xc3:
    local_5a0 = to_signed_basetype(uStack_59c);
    break;
  default:
    local_5a0 = type_00->basetype;
    break;
  case 0xaa:
  case 0xab:
    local_5a0 = to_signed_basetype(uStack_59c);
  }
  if (bVar3) {
    sVar14 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(in_RDX + 0x10));
    if (sVar14 < 2) {
      pCVar11 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar11,"Not enough arguments to OpSpecConstantOp.");
      __cxa_throw(pCVar11,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::__cxx11::string::string(local_5c8);
    this_00 = &expected_type.member_name_cache._M_h._M_single_bucket;
    ::std::__cxx11::string::string((string *)this_00);
    puVar12 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
    uVar6 = *puVar12;
    puVar12 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),1);
    binary_op_bitcast_helper
              ((SPIRType *)local_748,(CompilerGLSL *)cop,(string *)local_5c8,(string *)this_00,
               &local_5a0,uVar6,*puVar12,bVar5);
    if ((type_00->basetype == local_5a0) || (type_00->basetype == Boolean)) {
      join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                ((spirv_cross *)this,(char (*) [2])0x422b6e,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8,
                 (char (*) [2])0x40c6cb,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 (char (*) [2])0x40c6cb,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &expected_type.member_name_cache._M_h._M_single_bucket,(char (*) [2])0x40bd22);
    }
    else {
      expected_type.super_IVariant.self.id = local_5a0;
      local_749 = '\0';
      (*(cop->super_IVariant)._vptr_IVariant[0x3c])(this,cop,type_00,local_748);
      ::std::__cxx11::string::operator+=((string *)this,'(');
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (local_770,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8,
                 (char (*) [2])0x40c6cb,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 (char (*) [2])0x40c6cb,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &expected_type.member_name_cache._M_h._M_single_bucket);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_770);
      ::std::__cxx11::string::~string((string *)local_770);
      ::std::__cxx11::string::operator+=((string *)this,')');
      local_749 = '\x01';
    }
    SPIRType::~SPIRType((SPIRType *)local_748);
    ::std::__cxx11::string::~string
              ((string *)&expected_type.member_name_cache._M_h._M_single_bucket);
    ::std::__cxx11::string::~string(local_5c8);
  }
  else if (bVar2) {
    sVar14 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(in_RDX + 0x10));
    if (sVar14 == 0) {
      pCVar11 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar11,"Not enough arguments to OpSpecConstantOp.");
      __cxa_throw(pCVar11,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
    bitcast_glsl_abi_cxx11_((CompilerGLSL *)&arg_type,(SPIRType *)cop,(uint32_t)type_00);
    join<char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[2]>
              ((spirv_cross *)this,(char (*) [2])0x422b6e,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg_type,
               (char (*) [2])0x40bd22);
    ::std::__cxx11::string::~string((string *)&arg_type);
  }
  else if ((*(int *)(in_RDX + 0xc) == 0x72) || (*(int *)(in_RDX + 0xc) == 0x71)) {
    sVar14 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(in_RDX + 0x10));
    if (sVar14 == 0) {
      pCVar11 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar11,"Not enough arguments to OpSpecConstantOp.");
      __cxa_throw(pCVar11,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    puVar12 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
    expected.member_name_cache._M_h._M_single_bucket =
         (__node_base_ptr)Compiler::expression_type((Compiler *)cop,*puVar12);
    if ((((SPIRType *)expected.member_name_cache._M_h._M_single_bucket)->width < type_00->width) &&
       (local_5a0 != ((SPIRType *)expected.member_name_cache._M_h._M_single_bucket)->basetype)) {
      SPIRType::SPIRType((SPIRType *)(local_918 + 0x20),
                         (SPIRType *)expected.member_name_cache._M_h._M_single_bucket);
      expected.super_IVariant.self.id = local_5a0;
      VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
      bitcast_glsl_abi_cxx11_((CompilerGLSL *)local_918,(SPIRType *)cop,(int)local_918 + 0x20);
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                ((spirv_cross *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 (char (*) [2])0x422b6e,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_918,
                 (char (*) [2])0x40bd22);
      ::std::__cxx11::string::~string((string *)local_918);
      SPIRType::~SPIRType((SPIRType *)(local_918 + 0x20));
    }
    else {
      puVar12 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
      to_expression_abi_cxx11_((CompilerGLSL *)local_938,uVar6,SUB41(*puVar12,0));
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                ((spirv_cross *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 (char (*) [2])0x422b6e,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_938,
                 (char (*) [2])0x40bd22);
      ::std::__cxx11::string::~string((string *)local_938);
    }
  }
  else {
    sVar14 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(in_RDX + 0x10));
    if (sVar14 == 0) {
      pCVar11 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar11,"Not enough arguments to OpSpecConstantOp.");
      __cxa_throw(pCVar11,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    puVar12 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
    to_expression_abi_cxx11_((CompilerGLSL *)local_958,uVar6,SUB41(*puVar12,0));
    join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              ((spirv_cross *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               (char (*) [2])0x422b6e,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_958,
               (char (*) [2])0x40bd22);
    ::std::__cxx11::string::~string((string *)local_958);
  }
LAB_0017b9f5:
  ::std::__cxx11::string::~string(local_50);
  return this;
}

Assistant:

string CompilerGLSL::constant_op_expression(const SPIRConstantOp &cop)
{
	auto &type = get<SPIRType>(cop.basetype);
	bool binary = false;
	bool unary = false;
	string op;

	if (is_legacy() && is_unsigned_opcode(cop.opcode))
		SPIRV_CROSS_THROW("Unsigned integers are not supported on legacy targets.");

	// TODO: Find a clean way to reuse emit_instruction.
	switch (cop.opcode)
	{
	case OpSConvert:
	case OpUConvert:
	case OpFConvert:
		op = type_to_glsl_constructor(type);
		break;

#define GLSL_BOP(opname, x) \
	case Op##opname:        \
		binary = true;      \
		op = x;             \
		break

#define GLSL_UOP(opname, x) \
	case Op##opname:        \
		unary = true;       \
		op = x;             \
		break

		GLSL_UOP(SNegate, "-");
		GLSL_UOP(Not, "~");
		GLSL_BOP(IAdd, "+");
		GLSL_BOP(ISub, "-");
		GLSL_BOP(IMul, "*");
		GLSL_BOP(SDiv, "/");
		GLSL_BOP(UDiv, "/");
		GLSL_BOP(UMod, "%");
		GLSL_BOP(SMod, "%");
		GLSL_BOP(ShiftRightLogical, ">>");
		GLSL_BOP(ShiftRightArithmetic, ">>");
		GLSL_BOP(ShiftLeftLogical, "<<");
		GLSL_BOP(BitwiseOr, "|");
		GLSL_BOP(BitwiseXor, "^");
		GLSL_BOP(BitwiseAnd, "&");
		GLSL_BOP(LogicalOr, "||");
		GLSL_BOP(LogicalAnd, "&&");
		GLSL_UOP(LogicalNot, "!");
		GLSL_BOP(LogicalEqual, "==");
		GLSL_BOP(LogicalNotEqual, "!=");
		GLSL_BOP(IEqual, "==");
		GLSL_BOP(INotEqual, "!=");
		GLSL_BOP(ULessThan, "<");
		GLSL_BOP(SLessThan, "<");
		GLSL_BOP(ULessThanEqual, "<=");
		GLSL_BOP(SLessThanEqual, "<=");
		GLSL_BOP(UGreaterThan, ">");
		GLSL_BOP(SGreaterThan, ">");
		GLSL_BOP(UGreaterThanEqual, ">=");
		GLSL_BOP(SGreaterThanEqual, ">=");

	case OpSRem:
	{
		uint32_t op0 = cop.arguments[0];
		uint32_t op1 = cop.arguments[1];
		return join(to_enclosed_expression(op0), " - ", to_enclosed_expression(op1), " * ", "(",
		                 to_enclosed_expression(op0), " / ", to_enclosed_expression(op1), ")");
	}

	case OpSelect:
	{
		if (cop.arguments.size() < 3)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		// This one is pretty annoying. It's triggered from
		// uint(bool), int(bool) from spec constants.
		// In order to preserve its compile-time constness in Vulkan GLSL,
		// we need to reduce the OpSelect expression back to this simplified model.
		// If we cannot, fail.
		if (to_trivial_mix_op(type, op, cop.arguments[2], cop.arguments[1], cop.arguments[0]))
		{
			// Implement as a simple cast down below.
		}
		else
		{
			// Implement a ternary and pray the compiler understands it :)
			return to_ternary_expression(type, cop.arguments[0], cop.arguments[1], cop.arguments[2]);
		}
		break;
	}

	case OpVectorShuffle:
	{
		string expr = type_to_glsl_constructor(type);
		expr += "(";

		uint32_t left_components = expression_type(cop.arguments[0]).vecsize;
		string left_arg = to_enclosed_expression(cop.arguments[0]);
		string right_arg = to_enclosed_expression(cop.arguments[1]);

		for (uint32_t i = 2; i < uint32_t(cop.arguments.size()); i++)
		{
			uint32_t index = cop.arguments[i];
			if (index == 0xFFFFFFFF)
			{
				SPIRConstant c;
				c.constant_type = type.parent_type;
				assert(type.parent_type != ID(0));
				expr += constant_expression(c);
			}
			else if (index >= left_components)
			{
				expr += right_arg + "." + "xyzw"[index - left_components];
			}
			else
			{
				expr += left_arg + "." + "xyzw"[index];
			}

			if (i + 1 < uint32_t(cop.arguments.size()))
				expr += ", ";
		}

		expr += ")";
		return expr;
	}

	case OpCompositeExtract:
	{
		auto expr = access_chain_internal(cop.arguments[0], &cop.arguments[1], uint32_t(cop.arguments.size() - 1),
		                                  ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, nullptr);
		return expr;
	}

	case OpCompositeInsert:
	{
		SmallVector<ConstantID> new_init = get_composite_constant_ids(cop.arguments[1]);
		uint32_t idx;
		uint32_t target_id = cop.self;
		uint32_t target_type_id = cop.basetype;
		// We have to drill down to the part we want to modify, and create new
		// constants for each containing part.
		for (idx = 2; idx < cop.arguments.size() - 1; ++idx)
		{
			uint32_t new_const = ir.increase_bound_by(1);
			uint32_t old_const = new_init[cop.arguments[idx]];
			new_init[cop.arguments[idx]] = new_const;
			set_composite_constant(target_id, target_type_id, new_init);
			new_init = get_composite_constant_ids(old_const);
			target_id = new_const;
			target_type_id = get_composite_member_type(target_type_id, cop.arguments[idx]);
		}
		// Now replace the initializer with the one from this instruction.
		new_init[cop.arguments[idx]] = cop.arguments[0];
		set_composite_constant(target_id, target_type_id, new_init);
		SPIRConstant tmp_const(cop.basetype);
		fill_composite_constant(tmp_const, cop.basetype, const_composite_insert_ids[cop.self]);
		return constant_expression(tmp_const);
	}

	default:
		// Some opcodes are unimplemented here, these are currently not possible to test from glslang.
		SPIRV_CROSS_THROW("Unimplemented spec constant op.");
	}

	uint32_t bit_width = 0;
	if (unary || binary || cop.opcode == OpSConvert || cop.opcode == OpUConvert)
		bit_width = expression_type(cop.arguments[0]).width;

	SPIRType::BaseType input_type;
	bool skip_cast_if_equal_type = opcode_is_sign_invariant(cop.opcode);

	switch (cop.opcode)
	{
	case OpIEqual:
	case OpINotEqual:
		input_type = to_signed_basetype(bit_width);
		break;

	case OpSLessThan:
	case OpSLessThanEqual:
	case OpSGreaterThan:
	case OpSGreaterThanEqual:
	case OpSMod:
	case OpSDiv:
	case OpShiftRightArithmetic:
	case OpSConvert:
	case OpSNegate:
		input_type = to_signed_basetype(bit_width);
		break;

	case OpULessThan:
	case OpULessThanEqual:
	case OpUGreaterThan:
	case OpUGreaterThanEqual:
	case OpUMod:
	case OpUDiv:
	case OpShiftRightLogical:
	case OpUConvert:
		input_type = to_unsigned_basetype(bit_width);
		break;

	default:
		input_type = type.basetype;
		break;
	}

#undef GLSL_BOP
#undef GLSL_UOP
	if (binary)
	{
		if (cop.arguments.size() < 2)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		string cast_op0;
		string cast_op1;
		auto expected_type = binary_op_bitcast_helper(cast_op0, cast_op1, input_type, cop.arguments[0],
		                                              cop.arguments[1], skip_cast_if_equal_type);

		if (type.basetype != input_type && type.basetype != SPIRType::Boolean)
		{
			expected_type.basetype = input_type;
			auto expr = bitcast_glsl_op(type, expected_type);
			expr += '(';
			expr += join(cast_op0, " ", op, " ", cast_op1);
			expr += ')';
			return expr;
		}
		else
			return join("(", cast_op0, " ", op, " ", cast_op1, ")");
	}
	else if (unary)
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		// Auto-bitcast to result type as needed.
		// Works around various casting scenarios in glslang as there is no OpBitcast for specialization constants.
		return join("(", op, bitcast_glsl(type, cop.arguments[0]), ")");
	}
	else if (cop.opcode == OpSConvert || cop.opcode == OpUConvert)
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		auto &arg_type = expression_type(cop.arguments[0]);
		if (arg_type.width < type.width && input_type != arg_type.basetype)
		{
			auto expected = arg_type;
			expected.basetype = input_type;
			return join(op, "(", bitcast_glsl(expected, cop.arguments[0]), ")");
		}
		else
			return join(op, "(", to_expression(cop.arguments[0]), ")");
	}
	else
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");
		return join(op, "(", to_expression(cop.arguments[0]), ")");
	}
}